

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void make_pred(update_data_conflict *data,float x,float *wref)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  
  iVar1 = data->ON->m;
  if (data->ON->normalize == true) {
    fVar3 = wref[(long)iVar1 + 1];
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    x = x / fVar3;
  }
  fVar3 = *wref * x + data->prediction;
  data->prediction = fVar3;
  if (0 < iVar1) {
    uVar2 = 1;
    do {
      fVar3 = fVar3 + wref[uVar2] * x * data->ON->D[uVar2] * data->ON->b[uVar2];
      data->prediction = fVar3;
      uVar2 = uVar2 + 1;
    } while (iVar1 + 1 != uVar2);
  }
  return;
}

Assistant:

void make_pred(update_data& data, float x, float& wref)
{
  int m = data.ON->m;
  float* w = &wref;

  if (data.ON->normalize)
  {
    x /= sqrt(w[NORM2]);
  }

  data.prediction += w[0] * x;
  for (int i = 1; i <= m; i++)
  {
    data.prediction += w[i] * x * data.ON->D[i] * data.ON->b[i];
  }
}